

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerNewScObject
          (Lowerer *this,Instr *newObjInstr,bool callCtor,bool hasArgs,
          bool isBaseClassConstructorNewScObject)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  IRType type;
  Opnd *pOVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  FixedFieldInfo *this_00;
  intptr_t iVar7;
  ThreadContextInfo *pTVar8;
  intptr_t iVar9;
  HelperCallOpnd *pHVar10;
  Instr *insertBeforeInstrForCFG;
  LabelInstr *pLVar11;
  RegOpnd *pRVar12;
  IntConstOpnd *callInfo;
  JitProfilingInstr *pJVar13;
  byte local_159;
  JnHelperMethod local_144;
  byte local_121;
  LabelInstr *local_120;
  bool local_111;
  JitProfilingInstr *newObjJitProfilingInstr;
  IntConstOpnd *info;
  RegOpnd *savedCtorOpnd;
  RegOpnd *ctorResultObjOpnd;
  Instr *insertAfterCtorInstr;
  Instr *argInstr;
  AutoReuseOpnd autoReuseSavedCtorOpnd;
  Instr *ctorCall;
  intptr_t ctorInfo;
  FixedFieldInfo *ctor;
  JnHelperMethod ctorHelper;
  Instr *bailOutInstr;
  Instr *newScObjCall;
  Instr *pIStack_78;
  JnHelperMethod newScHelper;
  Instr *startCallInstr;
  LabelInstr *pLStack_68;
  bool usedFixedCtorCache;
  LabelInstr *callCtorLabel;
  LabelInstr *helperOrBailoutLabel;
  RegOpnd *createObjDst;
  bool emitBailOut;
  bool returnNewScObj;
  LabelInstr *pLStack_48;
  bool skipNewScObj;
  RegOpnd *newObjDst;
  Opnd *ctorOpnd;
  Instr *startMarkerInstr;
  Func *func;
  bool isSpreadCall;
  bool isBaseClassConstructorNewScObject_local;
  bool hasArgs_local;
  Instr *pIStack_20;
  bool callCtor_local;
  Instr *newObjInstr_local;
  Lowerer *this_local;
  
  func._5_1_ = isBaseClassConstructorNewScObject;
  func._6_1_ = hasArgs;
  func._7_1_ = callCtor;
  pIStack_20 = newObjInstr;
  newObjInstr_local = (Instr *)this;
  bVar3 = IR::Instr::IsJitProfilingInstr(newObjInstr);
  if ((bVar3) &&
     (pJVar13 = IR::Instr::AsJitProfilingInstr(pIStack_20),
     ((byte)pJVar13->field_0x60 >> 2 & 1) != 0)) {
    if ((func._7_1_ & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x117d,"(callCtor)","callCtor");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pJVar13 = IR::Instr::AsJitProfilingInstr(pIStack_20);
    pIVar6 = LowerProfiledNewArray(this,pJVar13,(bool)(func._6_1_ & 1));
    return pIVar6;
  }
  local_111 = true;
  if (pIStack_20->m_opcode != NewScObjectSpread) {
    local_111 = pIStack_20->m_opcode == NewScObjArraySpread;
  }
  func._4_1_ = local_111;
  startMarkerInstr = (Instr *)pIStack_20->m_func;
  ctorOpnd = (Opnd *)InsertLoweredRegionStartMarker(this,pIStack_20);
  newObjDst = (RegOpnd *)IR::Instr::GetSrc1(pIStack_20);
  pOVar4 = IR::Instr::GetDst(pIStack_20);
  pLStack_48 = (LabelInstr *)IR::Opnd::AsRegOpnd(pOVar4);
  if ((((func._7_1_ & 1) != 0) && ((func._6_1_ & 1) != 0)) &&
     (pOVar4 = IR::Instr::GetSrc2(pIStack_20), pOVar4 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x118e,"(!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr ))",
                       "!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr )");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  createObjDst._7_1_ = 0;
  createObjDst._6_1_ = 0;
  createObjDst._5_1_ = 0;
  if ((func._7_1_ & 1) == 0) {
    local_120 = pLStack_48;
  }
  else {
    local_120 = (LabelInstr *)IR::RegOpnd::New(TyVar,(Func *)startMarkerInstr);
  }
  helperOrBailoutLabel = local_120;
  callCtorLabel = IR::LabelInstr::New(Label,(Func *)startMarkerInstr,true);
  pLStack_68 = IR::LabelInstr::New(Label,(Func *)startMarkerInstr,false);
  startCallInstr._7_1_ =
       TryLowerNewScObjectWithFixedCtorCache
                 (this,pIStack_20,(RegOpnd *)helperOrBailoutLabel,callCtorLabel,pLStack_68,
                  (bool *)((long)&createObjDst + 7),(bool *)((long)&createObjDst + 6),
                  (bool *)((long)&createObjDst + 5));
  if (((createObjDst._7_1_ & 1) != 0) && ((func._7_1_ & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x119c,"(!skipNewScObj || callCtor)",
                       "What will we return if we skip the default new object and don\'t call the ctor?"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((createObjDst._7_1_ & 1) != 0) && ((createObjDst._6_1_ & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x119d,"(!skipNewScObj || !returnNewScObj)",
                       "!skipNewScObj || !returnNewScObj");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((startCallInstr._7_1_ & 1) == 0) && ((createObjDst._7_1_ & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x119e,"(usedFixedCtorCache || !skipNewScObj)",
                       "usedFixedCtorCache || !skipNewScObj");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((startCallInstr._7_1_ & 1) != 0) &&
     (bVar3 = IR::Instr::HasFixedFunctionAddressTarget(pIStack_20), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x119f,
                       "(!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget())",
                       "!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((createObjDst._7_1_ & 1) != 0) && ((createObjDst._5_1_ & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x11a0,"(!skipNewScObj || !emitBailOut)","!skipNewScObj || !emitBailOut");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIStack_78 = (Instr *)0x0;
  if (((func._7_1_ & 1) != 0) && ((func._6_1_ & 1) != 0)) {
    bVar3 = IR::Instr::HasEmptyArgOutChain(pIStack_20,&stack0xffffffffffffff88);
    func._6_1_ = (bVar3 ^ 0xffU) & 1;
  }
  newScObjCall._4_4_ = HelperInvalid;
  bailOutInstr = (Instr *)0x0;
  if ((createObjDst._7_1_ & 1) == 0) {
    if ((startCallInstr._7_1_ & 1) != 0) {
      IR::Instr::InsertBefore(pIStack_20,&callCtorLabel->super_Instr);
    }
    pIVar6 = pIStack_20;
    if ((createObjDst._5_1_ & 1) == 0) {
      bVar3 = IR::Opnd::CanStoreTemp((Opnd *)pLStack_48);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x11ca,"(!newObjDst->CanStoreTemp())","!newObjDst->CanStoreTemp()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      LoadScriptContext(this,pIStack_20);
      pIVar6 = pIStack_20;
      if ((func._7_1_ & 1) == 0) {
        if ((func._5_1_ & 1) == 0) {
          local_144 = HelperNewScObjectNoArgNoCtor;
          if ((func._6_1_ & 1) != 0) {
            local_144 = HelperNewScObjectNoCtor;
          }
        }
        else {
          local_144 = HelperNewScObjectNoArgNoCtorFull;
          if ((func._6_1_ & 1) != 0) {
            local_144 = HelperNewScObjectNoCtorFull;
          }
        }
        if (pLStack_68 == (LabelInstr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x11e1,"(callCtorLabel != nullptr)","callCtorLabel != nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        IR::Instr::InsertAfter(pIStack_20,&pLStack_68->super_Instr);
        pIVar6 = pIStack_20;
        pOVar4 = IR::Instr::UnlinkSrc1(pIStack_20);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar6,pOVar4);
        LowererMD::ChangeToHelperCall
                  (&this->m_lowererMD,pIStack_20,local_144,(LabelInstr *)0x0,(Opnd *)0x0,
                   (PropertySymOpnd *)0x0,false);
        if (helperOrBailoutLabel != pLStack_48) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x11e9,"(createObjDst == newObjDst)","createObjDst == newObjDst");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pIVar6 = RemoveLoweredRegionStartMarker(this,(Instr *)ctorOpnd);
        return pIVar6;
      }
      local_121 = 1;
      if ((func._6_1_ & 1) == 0) {
        local_121 = startCallInstr._7_1_;
      }
      newScObjCall._4_4_ = HelperNewScObjectNoArg;
      if ((local_121 & 1) != 0) {
        newScObjCall._4_4_ = HelperNewScObjectNoCtor;
      }
      pOVar4 = IR::Instr::GetSrc1(pIStack_20);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar6,pOVar4);
      pLVar11 = helperOrBailoutLabel;
      pHVar10 = IR::HelperCallOpnd::New(newScObjCall._4_4_,(Func *)startMarkerInstr);
      bailOutInstr = IR::Instr::New(Call,(Opnd *)pLVar11,&pHVar10->super_Opnd,
                                    (Func *)startMarkerInstr);
      IR::Instr::InsertBefore(pIStack_20,bailOutInstr);
      LowererMD::LowerCall(&this->m_lowererMD,bailOutInstr,0);
    }
    else {
      pIStack_20 = IR::Instr::New(pIStack_20->m_opcode,(Func *)startMarkerInstr);
      IR::Instr::TransferTo(pIVar6,pIStack_20);
      pIVar6->m_opcode = BailOut;
      IR::Instr::InsertAfter(pIVar6,pIStack_20);
      GenerateBailOut(this,pIVar6,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    }
  }
  local_159 = 1;
  if ((func._6_1_ & 1) == 0) {
    local_159 = startCallInstr._7_1_;
  }
  func._7_1_ = (func._7_1_ & 1 & local_159 & 1) != 0;
  if (((createObjDst._7_1_ & 1) != 0) && (!(bool)func._7_1_)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x11f5,"(!skipNewScObj || callCtor)",
                       "What will we return if we skip the default new object and don\'t call the ctor?"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  IR::Instr::InsertBefore(pIStack_20,&pLStack_68->super_Instr);
  if (((func._7_1_ & 1) != 0) && ((startCallInstr._7_1_ & 1) != 0)) {
    ctor._4_4_ = JnHelperMethodCount;
    this_00 = IR::Instr::GetFixedFunction(pIStack_20);
    iVar7 = FixedFieldInfo::GetFuncInfoAddr(this_00);
    if ((func._6_1_ & 1) == 0) {
      pTVar8 = Func::GetThreadContextInfo(this->m_func);
      iVar9 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr(pTVar8);
      if (iVar7 != iVar9) {
        pTVar8 = Func::GetThreadContextInfo(this->m_func);
        iVar9 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr(pTVar8);
        if (iVar7 != iVar9) goto LAB_0078ec11;
      }
      pTVar8 = Func::GetThreadContextInfo(this->m_func);
      iVar9 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr(pTVar8);
      if (iVar7 == iVar9) {
        if ((createObjDst._7_1_ & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1205,"(skipNewScObj)","skipNewScObj");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        ctor._4_4_ = HelperNewJavascriptObjectNoArg;
        func._7_1_ = 0;
      }
      else {
        pTVar8 = Func::GetThreadContextInfo(this->m_func);
        iVar9 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr(pTVar8);
        if (iVar7 == iVar9) {
          if ((createObjDst._7_1_ & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x120b,"(skipNewScObj)","skipNewScObj");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          ctor._4_4_ = HelperNewJavascriptArrayNoArg;
          func._7_1_ = 0;
        }
      }
      if ((func._7_1_ & 1) == 0) {
        LoadScriptContext(this,pIStack_20);
        pLVar11 = pLStack_48;
        pHVar10 = IR::HelperCallOpnd::New(ctor._4_4_,(Func *)startMarkerInstr);
        autoReuseSavedCtorOpnd._16_8_ =
             IR::Instr::New(Call,(Opnd *)pLVar11,&pHVar10->super_Opnd,(Func *)startMarkerInstr);
        IR::Instr::InsertBefore(pIStack_20,(Instr *)autoReuseSavedCtorOpnd._16_8_);
        LowererMD::LowerCall(&this->m_lowererMD,(Instr *)autoReuseSavedCtorOpnd._16_8_,0);
      }
    }
  }
LAB_0078ec11:
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&argInstr);
  if ((func._7_1_ & 1) == 0) {
    bVar3 = IR::Instr::IsJitProfilingInstr(pIStack_20);
    if (bVar3) {
      bVar3 = Func::IsSimpleJit(this->m_func);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x125b,"(m_func->IsSimpleJit())","m_func->IsSimpleJit()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if ((DAT_01eafdac & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x125c,"(!(Js::Configuration::Global.flags.NewSimpleJit))",
                           "!CONFIG_FLAG(NewSimpleJit)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (((newScObjCall._4_4_ == HelperNewScObjectNoArg) && (pLStack_48 != (LabelInstr *)0x0)) &&
         (bVar3 = IR::Opnd::IsRegOpnd(&newObjDst->super_Opnd), bVar3)) {
        pRVar12 = IR::Opnd::AsRegOpnd((Opnd *)pLStack_48);
        pSVar1 = pRVar12->m_sym;
        pRVar12 = IR::Opnd::AsRegOpnd(&newObjDst->super_Opnd);
        if (pSVar1 == pRVar12->m_sym) {
          bVar3 = Func::IsSimpleJit(pIStack_20->m_func);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1266,"(newObjInstr->m_func->IsSimpleJit())",
                               "newObjInstr->m_func->IsSimpleJit()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          if (helperOrBailoutLabel == pLStack_48) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1267,"(createObjDst != newObjDst)","createObjDst != newObjDst");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          type = IR::Opnd::GetType(&newObjDst->super_Opnd);
          pRVar12 = IR::RegOpnd::New(type,pIStack_20->m_func);
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)&argInstr,&pRVar12->super_Opnd,pIStack_20->m_func,true);
          InsertMove(&pRVar12->super_Opnd,&newObjDst->super_Opnd,pIStack_20,true);
          newObjDst = pRVar12;
        }
      }
      callInfo = MakeCallInfoConst(1,1,(Func *)startMarkerInstr);
      if (bailOutInstr == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1273,"(newScObjCall)","newScObjCall");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pJVar13 = IR::Instr::AsJitProfilingInstr(pIStack_20);
      GenerateCallProfiling
                (this,pJVar13->profileId,(pJVar13->field_2).inlineCacheIndex,
                 (Opnd *)helperOrBailoutLabel,&newObjDst->super_Opnd,&callInfo->super_Opnd,false,
                 bailOutInstr,pIStack_20);
    }
    if (((createObjDst._7_1_ & 1) == 0) && (helperOrBailoutLabel != pLStack_48)) {
      InsertMove((Opnd *)pLStack_48,(Opnd *)helperOrBailoutLabel,pIStack_20,true);
    }
    IR::Instr::Remove(pIStack_20);
  }
  else {
    insertBeforeInstrForCFG =
         LowererMD::LoadNewScObjFirstArg
                   (&this->m_lowererMD,pIStack_20,(Opnd *)helperOrBailoutLabel,func._4_1_ & 1);
    pIVar6 = pIStack_20->m_next;
    if ((createObjDst._7_1_ & 1) == 0) {
      pRVar12 = IR::RegOpnd::New(TyVar,(Func *)startMarkerInstr);
      IR::Instr::UnlinkDst(pIStack_20);
      IR::Instr::SetDst(pIStack_20,&pRVar12->super_Opnd);
      if ((func._4_1_ & 1) == 0) {
        pIStack_20 = LowererMD::LowerCallI
                               (&this->m_lowererMD,pIStack_20,1,false,insertBeforeInstrForCFG);
      }
      else {
        pIStack_20 = LowerSpreadCall(this,pIStack_20,CallFlags_New,false);
      }
      if ((createObjDst._6_1_ & 1) == 0) {
        LowerGetNewScObjectCommon(this,pRVar12,pRVar12,(RegOpnd *)helperOrBailoutLabel,pIVar6);
        InsertMove((Opnd *)pLStack_48,&pRVar12->super_Opnd,pIVar6,true);
      }
      else {
        InsertMove((Opnd *)pLStack_48,(Opnd *)helperOrBailoutLabel,pIVar6,true);
      }
    }
    else {
      pLVar11 = (LabelInstr *)IR::Instr::GetDst(pIStack_20);
      if (pLVar11 != pLStack_48) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1228,"(newObjInstr->GetDst() == newObjDst)",
                           "newObjInstr->GetDst() == newObjDst");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if ((func._4_1_ & 1) == 0) {
        pIStack_20 = LowererMD::LowerCallI
                               (&this->m_lowererMD,pIStack_20,1,false,insertBeforeInstrForCFG);
      }
      else {
        pIStack_20 = LowerSpreadCall(this,pIStack_20,CallFlags_New,false);
      }
    }
    if ((startCallInstr._7_1_ & 1) == 0) {
      LowerUpdateNewScObjectCache(this,pIVar6,(Opnd *)pLStack_48,&newObjDst->super_Opnd,false);
    }
  }
  this_local = (Lowerer *)RemoveLoweredRegionStartMarker(this,(Instr *)ctorOpnd);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&argInstr);
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObject(IR::Instr *newObjInstr, bool callCtor, bool hasArgs, bool isBaseClassConstructorNewScObject)
{
    if (newObjInstr->IsJitProfilingInstr() && newObjInstr->AsJitProfilingInstr()->isNewArray)
    {
        Assert(callCtor);
        return LowerProfiledNewArray(newObjInstr->AsJitProfilingInstr(), hasArgs);
    }

    bool isSpreadCall = newObjInstr->m_opcode == Js::OpCode::NewScObjectSpread ||
        newObjInstr->m_opcode == Js::OpCode::NewScObjArraySpread;

    Func* func = newObjInstr->m_func;

    // Insert a temporary label before the instruction we're about to lower, so that we can return
    // the first instruction above that needs to be lowered after we're done - regardless of argument
    // list, StartCall, etc.
    IR::Instr* startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

    IR::Opnd *ctorOpnd = newObjInstr->GetSrc1();
    IR::RegOpnd *newObjDst = newObjInstr->GetDst()->AsRegOpnd();

    Assert(!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr /*&& newObjInstr->GetSrc2()->IsSymOpnd()*/));

    bool skipNewScObj = false;
    bool returnNewScObj = false;
    bool emitBailOut = false;
    // If we haven't yet split NewScObject into NewScObjectNoCtor and CallI, we will need a temporary register
    // to hold the result of the object allocation.
    IR::RegOpnd* createObjDst = callCtor ? IR::RegOpnd::New(TyVar, func) : newObjDst;
    IR::LabelInstr* helperOrBailoutLabel = IR::LabelInstr::New(Js::OpCode::Label, func, /* isOpHelper = */ true);
    IR::LabelInstr* callCtorLabel = IR::LabelInstr::New(Js::OpCode::Label, func, /* isOpHelper = */ false);

    // Try to emit the fast allocation and construction path.
    bool usedFixedCtorCache = TryLowerNewScObjectWithFixedCtorCache(newObjInstr, createObjDst, helperOrBailoutLabel, callCtorLabel, skipNewScObj, returnNewScObj, emitBailOut);

    AssertMsg(!skipNewScObj || callCtor, "What will we return if we skip the default new object and don't call the ctor?");
    Assert(!skipNewScObj || !returnNewScObj);
    Assert(usedFixedCtorCache || !skipNewScObj);
    Assert(!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget());
    Assert(!skipNewScObj || !emitBailOut);

#if DBG && 0 // TODO: OOP JIT, enable assert
    if (usedFixedCtorCache)
    {
        Js::JavascriptFunction* ctor = newObjInstr->GetFixedFunction();
        Js::FunctionInfo* ctorInfo = ctor->GetFunctionInfo();
        Assert((ctorInfo->GetAttributes() & Js::FunctionInfo::Attributes::ErrorOnNew) == 0);
        Assert(!!(ctorInfo->GetAttributes() & Js::FunctionInfo::Attributes::SkipDefaultNewObject) == skipNewScObj);
    }
#endif

    IR::Instr* startCallInstr = nullptr;
    if (callCtor && hasArgs)
    {
        hasArgs = !newObjInstr->HasEmptyArgOutChain(&startCallInstr);
    }

    // If we're not skipping the default new object, let's emit bailout or a call to NewScObject* helper
    IR::JnHelperMethod newScHelper = IR::HelperInvalid;
    IR::Instr *newScObjCall = nullptr;
    if (!skipNewScObj)
    {
        // If we emitted the fast path, this block is a helper block.
        if (usedFixedCtorCache)
        {
            newObjInstr->InsertBefore(helperOrBailoutLabel);
        }

        if (emitBailOut)
        {
            IR::Instr* bailOutInstr = newObjInstr;

            newObjInstr = IR::Instr::New(newObjInstr->m_opcode, func);
            bailOutInstr->TransferTo(newObjInstr);
            bailOutInstr->m_opcode = Js::OpCode::BailOut;
            bailOutInstr->InsertAfter(newObjInstr);

            GenerateBailOut(bailOutInstr);
        }
        else
        {
            Assert(!newObjDst->CanStoreTemp());
            // createObjDst = NewScObject...(ctorOpnd)

            LoadScriptContext(newObjInstr);

            if (callCtor)
            {
                newScHelper = (hasArgs || usedFixedCtorCache ? IR::HelperNewScObjectNoCtor : IR::HelperNewScObjectNoArg);

                m_lowererMD.LoadHelperArgument(newObjInstr, newObjInstr->GetSrc1());

                newScObjCall = IR::Instr::New(Js::OpCode::Call, createObjDst, IR::HelperCallOpnd::New(newScHelper, func), func);
                newObjInstr->InsertBefore(newScObjCall);
                m_lowererMD.LowerCall(newScObjCall, 0);
            }
            else
            {
                newScHelper = 
                    (isBaseClassConstructorNewScObject ?
                        (hasArgs ? IR::HelperNewScObjectNoCtorFull : IR::HelperNewScObjectNoArgNoCtorFull) :
                        (hasArgs ? IR::HelperNewScObjectNoCtor : IR::HelperNewScObjectNoArgNoCtor));

                // Branch around the helper call to execute the inlined ctor.
                Assert(callCtorLabel != nullptr);
                newObjInstr->InsertAfter(callCtorLabel);

                // Change the NewScObject* to a helper call on the spot. This generates implicit call bailout for us if we need one.
                m_lowererMD.LoadHelperArgument(newObjInstr, newObjInstr->UnlinkSrc1());
                m_lowererMD.ChangeToHelperCall(newObjInstr, newScHelper);

                // Then we're done.
                Assert(createObjDst == newObjDst);

                // Return the first instruction above the region we've just lowered.
                return RemoveLoweredRegionStartMarker(startMarkerInstr);                    
            }
        }
    }

    // If we call HelperNewScObjectNoArg directly, we won't be calling the constructor from here, because the helper will do it.
    // We could probably avoid this complexity by converting NewScObjectNoArg to NewScObject in the IRBuilder, once we have dedicated
    // code paths for new Object() and new Array().
    callCtor &= hasArgs || usedFixedCtorCache;
    AssertMsg(!skipNewScObj || callCtor, "What will we return if we skip the default new object and don't call the ctor?");

    newObjInstr->InsertBefore(callCtorLabel);

    if (callCtor && usedFixedCtorCache)
    {
        IR::JnHelperMethod ctorHelper = IR::JnHelperMethodCount;

        // If we have no arguments (i.e. the argument chain is empty), we can recognize a couple of common special cases, such
        // as new Object() or new Array(), for which we have optimized helpers.
        FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();
        intptr_t ctorInfo = ctor->GetFuncInfoAddr();
        if (!hasArgs && (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr() || ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr()))
        {
            if (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr())
            {
                Assert(skipNewScObj);
                ctorHelper = IR::HelperNewJavascriptObjectNoArg;
                callCtor = false;
            }
            else if (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr())
            {
                Assert(skipNewScObj);
                ctorHelper = IR::HelperNewJavascriptArrayNoArg;
                callCtor = false;
            }

            if (!callCtor)
            {
                LoadScriptContext(newObjInstr);

                IR::Instr *ctorCall = IR::Instr::New(Js::OpCode::Call, newObjDst,  IR::HelperCallOpnd::New(ctorHelper, func), func);
                newObjInstr->InsertBefore(ctorCall);
                m_lowererMD.LowerCall(ctorCall, 0);
            }
        }
    }

    IR::AutoReuseOpnd autoReuseSavedCtorOpnd;
    if (callCtor)
    {
        // Load the first argument, which is either the object just created or null. Spread has an extra argument.
        IR::Instr * argInstr = this->m_lowererMD.LoadNewScObjFirstArg(newObjInstr, createObjDst, isSpreadCall ? 1 : 0);

        IR::Instr * insertAfterCtorInstr = newObjInstr->m_next;

        if (skipNewScObj)
        {
            // Since we skipped the default new object, we must be returning whatever the constructor returns
            // (which better be an Object), so let's just use newObjDst directly.
            // newObjDst = newObjInstr->m_src1(createObjDst, ...)
            Assert(newObjInstr->GetDst() == newObjDst);
            if (isSpreadCall)
            {
                newObjInstr = this->LowerSpreadCall(newObjInstr, Js::CallFlags_New);
            }
            else
            {
                newObjInstr = this->m_lowererMD.LowerCallI(newObjInstr, Js::CallFlags_New, false, argInstr);
            }
        }
        else
        {
            // We may need to return the default new object or whatever the constructor returns. Let's stash
            // away the constructor's return in a temporary operand, and do the right check, if necessary.
            // ctorResultObjOpnd = newObjInstr->m_src1(createObjDst, ...)
            IR::RegOpnd *ctorResultObjOpnd = IR::RegOpnd::New(TyVar, func);
            newObjInstr->UnlinkDst();
            newObjInstr->SetDst(ctorResultObjOpnd);

            if (isSpreadCall)
            {
                newObjInstr = this->LowerSpreadCall(newObjInstr, Js::CallFlags_New);
            }
            else
            {
                newObjInstr = this->m_lowererMD.LowerCallI(newObjInstr, Js::CallFlags_New, false, argInstr);
            }

            if (returnNewScObj)
            {
                // MOV newObjDst, createObjDst
                this->InsertMove(newObjDst, createObjDst, insertAfterCtorInstr);
            }
            else
            {
                LowerGetNewScObjectCommon(ctorResultObjOpnd, ctorResultObjOpnd, createObjDst, insertAfterCtorInstr);
                this->InsertMove(newObjDst, ctorResultObjOpnd, insertAfterCtorInstr);
            }
        }

        // We don't ever need to update the constructor cache, if we hard coded it.  Caches requiring update after constructor
        // don't get cloned, and those that don't require update will never need one anymore.
        if (!usedFixedCtorCache)
        {
            LowerUpdateNewScObjectCache(insertAfterCtorInstr, newObjDst, ctorOpnd, false /* isCtorFunction */);
        }
    }
    else
    {
        if (newObjInstr->IsJitProfilingInstr())
        {
            Assert(m_func->IsSimpleJit());
            Assert(!CONFIG_FLAG(NewSimpleJit));

            // This path skipped calling the Ctor, which skips calling LowerCallI with newObjInstr, meaning that the call will not be profiled.
            //   So we insert it manually here.

            if(newScHelper == IR::HelperNewScObjectNoArg &&
                newObjDst &&
                ctorOpnd->IsRegOpnd() &&
                newObjDst->AsRegOpnd()->m_sym == ctorOpnd->AsRegOpnd()->m_sym)
            {
                Assert(newObjInstr->m_func->IsSimpleJit());
                Assert(createObjDst != newObjDst);

                // The function object sym is going to be overwritten, so save it in a temp for profiling
                IR::RegOpnd *const savedCtorOpnd = IR::RegOpnd::New(ctorOpnd->GetType(), newObjInstr->m_func);
                autoReuseSavedCtorOpnd.Initialize(savedCtorOpnd, newObjInstr->m_func);
                Lowerer::InsertMove(savedCtorOpnd, ctorOpnd, newObjInstr);
                ctorOpnd = savedCtorOpnd;
            }

            // It is a constructor (CallFlags_New) and therefore a single argument (this) would have been given.
            const auto info = Lowerer::MakeCallInfoConst(Js::CallFlags_New, 1, func);

            Assert(newScObjCall);
            IR::JitProfilingInstr *const newObjJitProfilingInstr = newObjInstr->AsJitProfilingInstr();
            GenerateCallProfiling(
                newObjJitProfilingInstr->profileId,
                newObjJitProfilingInstr->inlineCacheIndex,
                createObjDst,
                ctorOpnd,
                info,
                false,
                newScObjCall,
                newObjInstr);
        }

        // MOV newObjDst, createObjDst
        if (!skipNewScObj && createObjDst != newObjDst)
        {
            this->InsertMove(newObjDst, createObjDst, newObjInstr);
        }
        newObjInstr->Remove();
    }

    // Return the first instruction above the region we've just lowered.
    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}